

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall
Highs::returnFromRun(Highs *this,HighsStatus run_return_status,bool undo_mods)

{
  HighsSolution *solution;
  HighsBasis *basis;
  HighsModel *lp;
  bool bVar1;
  bool bVar2;
  size_t __n;
  size_t __n_00;
  bool bVar3;
  HighsStatus HVar4;
  HighsDebugStatus HVar5;
  int iVar6;
  undefined7 in_register_00000011;
  HighsStatus return_status;
  HighsStatus local_78;
  undefined4 local_74;
  string local_70;
  string local_50;
  
  local_74 = (undefined4)CONCAT71(in_register_00000011,undo_mods);
  HVar4 = highsStatusFromHighsModelStatus(this->model_status_);
  local_78 = HVar4;
  if (HVar4 != run_return_status) {
    utilModelStatusToString_abi_cxx11_(&local_50,this->model_status_);
    printf("Highs::returnFromRun: return_status = %d != %d = run_return_status For model_status_ = %s\n"
           ,(ulong)(uint)HVar4,(ulong)(uint)run_return_status,local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  switch(this->model_status_) {
  case kMin:
  case kLoadError:
  case kModelError:
  case kPresolveError:
  case kSolveError:
  case kPostsolveError:
  case kModelEmpty:
  case kMax:
    HighsInfo::invalidate(&this->info_);
    (this->info_).super_HighsInfoStruct.primal_solution_status = 0;
    (this->info_).super_HighsInfoStruct.dual_solution_status = 0;
    (this->info_).super_HighsInfoStruct.num_primal_infeasibilities = -1;
    (this->info_).super_HighsInfoStruct.max_primal_infeasibility = INFINITY;
    (this->info_).super_HighsInfoStruct.sum_primal_infeasibilities = INFINITY;
    (this->info_).super_HighsInfoStruct.num_dual_infeasibilities = -1;
    (this->info_).super_HighsInfoStruct.max_dual_infeasibility = INFINITY;
    (this->info_).super_HighsInfoStruct.sum_dual_infeasibilities = INFINITY;
    HighsSolution::invalidate(&this->solution_);
    (this->info_).super_HighsInfoStruct.basis_validity = 0;
    HighsBasis::invalidate(&this->basis_);
    break;
  case kUnboundedOrInfeasible:
    if (((((this->options_).super_HighsOptionsStruct.allow_unbounded_or_infeasible == false) &&
         (((__n = (this->options_).super_HighsOptionsStruct.solver._M_string_length,
           __n != ::kIpmString_abi_cxx11_._M_string_length ||
           (((__n != 0 &&
             (iVar6 = bcmp((this->options_).super_HighsOptionsStruct.solver._M_dataplus._M_p,
                           ::kIpmString_abi_cxx11_._M_dataplus._M_p,__n), iVar6 != 0)) ||
            (__n_00 = (this->options_).super_HighsOptionsStruct.run_crossover._M_string_length,
            __n_00 != ::kHighsOnString_abi_cxx11_._M_string_length)))) ||
          ((__n_00 != 0 &&
           (iVar6 = bcmp((this->options_).super_HighsOptionsStruct.run_crossover._M_dataplus._M_p,
                         ::kHighsOnString_abi_cxx11_._M_dataplus._M_p,__n_00), iVar6 != 0)))))) &&
        ((__n != ::kPdlpString_abi_cxx11_._M_string_length ||
         ((__n != 0 &&
          (iVar6 = bcmp((this->options_).super_HighsOptionsStruct.solver._M_dataplus._M_p,
                        ::kPdlpString_abi_cxx11_._M_dataplus._M_p,__n), iVar6 != 0)))))) &&
       (bVar3 = HighsLp::isMip(&(this->model_).lp_), !bVar3)) {
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                   "returnFromHighs: HighsModelStatus::kUnboundedOrInfeasible is not permitted\n");
      local_78 = kError;
    }
  }
  solution = &this->solution_;
  bVar3 = (this->solution_).value_valid;
  bVar1 = (this->solution_).dual_valid;
  bVar2 = (this->basis_).valid;
  if ((bVar3 == true) &&
     (HVar5 = debugPrimalSolutionRightSize(&this->options_,&(this->model_).lp_,solution),
     HVar5 == kLogicalError)) {
    local_78 = kError;
  }
  if ((bVar1 != false) &&
     (HVar5 = debugDualSolutionRightSize(&this->options_,&(this->model_).lp_,solution),
     HVar5 == kLogicalError)) {
    local_78 = kError;
  }
  basis = &this->basis_;
  if ((bVar2 != false) &&
     (HVar5 = debugBasisRightSize(&this->options_,&(this->model_).lp_,basis), HVar5 == kLogicalError
     )) {
    local_78 = kError;
  }
  if (bVar3 != false) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Return from run()","");
    HVar5 = debugHighsSolution(&local_70,&this->options_,&this->model_,solution,basis,
                               this->model_status_,&this->info_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (HVar5 == kLogicalError) {
      local_78 = kError;
    }
  }
  lp = &this->model_;
  HVar5 = debugInfo(&this->options_,&lp->lp_,basis,solution,&this->info_,this->model_status_);
  if (HVar5 == kLogicalError) {
    local_78 = kError;
  }
  this->called_return_from_run = true;
  if ((char)local_74 != '\0') {
    restoreInfCost(this,&local_78);
    HighsLp::unapplyMods(&lp->lp_);
  }
  iVar6 = std::__cxx11::string::compare((string *)&(this->options_).super_HighsOptionsStruct.solver)
  ;
  if (((iVar6 != 0) || (bVar3 = HighsLp::isMip(&lp->lp_), !bVar3)) ||
     (((this->options_).super_HighsOptionsStruct.solve_relaxation & 1U) != 0)) {
    reportSolvedLpQpStats(this);
  }
  HVar4 = returnFromHighs(this,local_78);
  return HVar4;
}

Assistant:

HighsStatus Highs::returnFromRun(const HighsStatus run_return_status,
                                 const bool undo_mods) {
  assert(!called_return_from_run);
  HighsStatus return_status = highsStatusFromHighsModelStatus(model_status_);
  if (return_status != run_return_status) {
    printf(
        "Highs::returnFromRun: return_status = %d != %d = run_return_status "
        "For model_status_ = %s\n",
        int(return_status), int(run_return_status),
        modelStatusToString(model_status_).c_str());
  }
  assert(return_status == run_return_status);
  //  return_status = run_return_status;
  switch (model_status_) {
      // First consider the error returns
    case HighsModelStatus::kNotset:
    case HighsModelStatus::kLoadError:
    case HighsModelStatus::kModelError:
    case HighsModelStatus::kPresolveError:
    case HighsModelStatus::kSolveError:
    case HighsModelStatus::kPostsolveError:
    case HighsModelStatus::kMemoryLimit:
      // Don't clear the model status!
      //      invalidateSolverData();
      invalidateInfo();
      invalidateSolution();
      invalidateBasis();
      assert(return_status == HighsStatus::kError);
      break;

      // Then consider the OK returns
    case HighsModelStatus::kModelEmpty:
      invalidateInfo();
      invalidateSolution();
      invalidateBasis();
      assert(return_status == HighsStatus::kOk);
      break;

    case HighsModelStatus::kOptimal:
      // The following is an aspiration
      //
      // assert(info_.primal_solution_status == kSolutionStatusFeasible);
      //
      // assert(info_.dual_solution_status == kSolutionStatusFeasible);
      assert(model_status_ == HighsModelStatus::kNotset ||
             model_status_ == HighsModelStatus::kOptimal);
      assert(return_status == HighsStatus::kOk);
      break;

    case HighsModelStatus::kInfeasible:
    case HighsModelStatus::kUnbounded:
    case HighsModelStatus::kObjectiveBound:
    case HighsModelStatus::kObjectiveTarget:
      // For kInfeasible, will not have a basis, if infeasibility was
      // detected in presolve or by IPX without crossover
      assert(return_status == HighsStatus::kOk);
      break;

    case HighsModelStatus::kUnboundedOrInfeasible:
      if (options_.allow_unbounded_or_infeasible ||
          (options_.solver == kIpmString &&
           options_.run_crossover == kHighsOnString) ||
          (options_.solver == kPdlpString) || model_.isMip()) {
        assert(return_status == HighsStatus::kOk);
      } else {
        // This model status is not permitted unless IPM is run without
        // crossover, or if PDLP is used
        highsLogUser(
            options_.log_options, HighsLogType::kError,
            "returnFromHighs: HighsModelStatus::kUnboundedOrInfeasible is not "
            "permitted\n");
        assert(options_.allow_unbounded_or_infeasible);
        return_status = HighsStatus::kError;
      }
      break;

      // Finally consider the warning returns
    case HighsModelStatus::kTimeLimit:
    case HighsModelStatus::kIterationLimit:
    case HighsModelStatus::kSolutionLimit:
    case HighsModelStatus::kInterrupt:
    case HighsModelStatus::kUnknown:
      assert(return_status == HighsStatus::kWarning);
      break;
    default:
      // All cases should have been considered so assert on reaching here
      assert(1 == 0);
  }
  // Now to check what's available with each model status
  //
  const bool have_info = info_.valid;
  const bool have_primal_solution = solution_.value_valid;
  const bool have_dual_solution = solution_.dual_valid;
  // Can't have a dual solution without a primal solution
  assert(have_primal_solution || !have_dual_solution);
  //  const bool have_solution = have_primal_solution && have_dual_solution;
  const bool have_basis = basis_.valid;
  switch (model_status_) {
    case HighsModelStatus::kNotset:
    case HighsModelStatus::kLoadError:
    case HighsModelStatus::kModelError:
    case HighsModelStatus::kPresolveError:
    case HighsModelStatus::kSolveError:
    case HighsModelStatus::kPostsolveError:
    case HighsModelStatus::kModelEmpty:
    case HighsModelStatus::kMemoryLimit:
      // No info, primal solution or basis
      assert(have_info == false);
      assert(have_primal_solution == false);
      assert(have_basis == false);
      break;
    case HighsModelStatus::kOptimal:
    case HighsModelStatus::kInfeasible:
    case HighsModelStatus::kUnbounded:
    case HighsModelStatus::kObjectiveBound:
    case HighsModelStatus::kObjectiveTarget:
    case HighsModelStatus::kUnboundedOrInfeasible:
    case HighsModelStatus::kTimeLimit:
    case HighsModelStatus::kIterationLimit:
    case HighsModelStatus::kSolutionLimit:
    case HighsModelStatus::kInterrupt:
    case HighsModelStatus::kUnknown:
      // Have info and primal solution (unless infeasible). No primal solution
      // in some other case, too!
      assert(have_info == true);
      break;
    default:
      // All cases should have been considered so assert on reaching here
      assert(1 == 0);
  }
  if (have_primal_solution) {
    if (debugPrimalSolutionRightSize(options_, model_.lp_, solution_) ==
        HighsDebugStatus::kLogicalError)
      return_status = HighsStatus::kError;
  }
  if (have_dual_solution) {
    if (debugDualSolutionRightSize(options_, model_.lp_, solution_) ==
        HighsDebugStatus::kLogicalError)
      return_status = HighsStatus::kError;
  }
  if (have_basis) {
    if (debugBasisRightSize(options_, model_.lp_, basis_) ==
        HighsDebugStatus::kLogicalError)
      return_status = HighsStatus::kError;
  }
  if (have_primal_solution) {
    // Debug the Highs solution - needs primal values at least
    if (debugHighsSolution("Return from run()", options_, model_, solution_,
                           basis_, model_status_,
                           info_) == HighsDebugStatus::kLogicalError)
      return_status = HighsStatus::kError;
  }
  if (debugInfo(options_, model_.lp_, basis_, solution_, info_,
                model_status_) == HighsDebugStatus::kLogicalError)
    return_status = HighsStatus::kError;

  // Record that returnFromRun() has been called
  called_return_from_run = true;

  if (undo_mods) {
    // Restore any infinite costs
    this->restoreInfCost(return_status);

    // Unapply any modifications that have not yet been unapplied
    this->model_.lp_.unapplyMods();
    //    undo_mods = false;
  }

  // Unless solved as a MIP, report on the solution
  const bool solved_as_mip = !options_.solver.compare(kHighsChooseString) &&
                             model_.isMip() && !options_.solve_relaxation;
  if (!solved_as_mip) reportSolvedLpQpStats();
  return returnFromHighs(return_status);
}